

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O3

void predict_iforest(double *numeric_data,int *categ_data,bool is_col_major,size_t ncols_numeric,
                    size_t ncols_categ,double *Xc,size_t *Xc_ind,size_t *Xc_indptr,double *Xr,
                    size_t *Xr_ind,size_t *Xr_indptr,size_t nrows,int nthreads,bool standardize,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *output_depths,
                    size_t *tree_num,double *per_tree_depths,TreesIndexer *indexer)

{
  double dVar1;
  pointer pSVar2;
  pointer puVar3;
  pointer pIVar4;
  ulong uVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  long lVar8;
  size_t sVar9;
  ExtIsoForest *pEVar10;
  pointer pvVar11;
  pointer pvVar12;
  undefined8 uVar13;
  ScoringMetric SVar14;
  PredictionData<double,_unsigned_long> *extraout_RDX;
  PredictionData<double,_unsigned_long> *extraout_RDX_00;
  PredictionData<double,_unsigned_long> *extraout_RDX_01;
  pointer pvVar15;
  pointer pvVar16;
  undefined7 in_register_00000011;
  PredictionData<double,_unsigned_long> *pPVar17;
  size_t *psVar18;
  double *pdVar19;
  size_t sVar20;
  uint uVar21;
  undefined7 uVar23;
  size_t *psVar22;
  pointer pvVar24;
  pointer pvVar25;
  size_t *psVar26;
  pointer pIVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dStack_f0;
  undefined8 uStack_e8;
  double dStack_e0;
  double dStack_d8;
  double dStack_d0;
  long lStack_c0;
  ulong uStack_b8;
  int *piStack_b0;
  long alStack_a8 [2];
  int iStack_94;
  PredictionData<double,_unsigned_long> PStack_90;
  
  pPVar17 = (PredictionData<double,_unsigned_long> *)CONCAT71(in_register_00000011,is_col_major);
  if (nrows == 0) {
    return;
  }
  PStack_90.nrows = nrows;
  PStack_90.Xc_ind = Xc_ind;
  PStack_90.Xc_indptr = Xc_indptr;
  PStack_90.Xr = Xr;
  PStack_90.Xr_ind = Xr_ind;
  iStack_94 = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    iStack_94 = nthreads;
  }
  PStack_90.Xr_indptr = Xr_indptr;
  piStack_b0 = categ_data;
  PStack_90.numeric_data = numeric_data;
  PStack_90.categ_data = categ_data;
  PStack_90.is_col_major = is_col_major;
  PStack_90.ncols_numeric = ncols_numeric;
  PStack_90.ncols_categ = ncols_categ;
  PStack_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (size_t *)0x0) {
    batched_csc_predict<double,unsigned_long>
              (&PStack_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
    pPVar17 = extraout_RDX;
LAB_00145435:
    if (model_outputs != (IsoForest *)0x0) {
      pvVar24 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar16 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00145441;
    }
    lVar8 = ((long)(model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    auVar34._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar34._0_8_ = lVar8;
    auVar34._12_4_ = 0x45300000;
    dStack_d0 = auVar34._8_8_ - 1.9342813113834067e+25;
    dStack_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dVar35 = model_outputs_ext->exp_avg_depth * dStack_d8;
    SVar14 = model_outputs_ext->scoring_metric;
    bVar30 = SVar14 == Density;
    bVar31 = SVar14 == BoxedRatio;
    uVar21 = (uint)(SVar14 == BoxedDensity);
    uStack_e8 = CONCAT44(uStack_e8._4_4_,(int)CONCAT71((int7)((ulong)pPVar17 >> 8),1));
LAB_00145553:
    bVar32 = SVar14 == BoxedDensity2;
  }
  else {
    if (model_outputs == (IsoForest *)0x0) {
      if ((((Xc_indptr == (size_t *)0x0) && (model_outputs_ext->missing_action == Fail)) &&
          (Xr_indptr == (size_t *)0x0)) &&
         ((categ_data == (int *)0x0 && (model_outputs_ext->has_range_penalty == false)))) {
        pvVar12 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (nrows == 1 || !is_col_major) {
          lVar8 = 0;
          dStack_d8 = 0.0;
          do {
            dStack_f0 = 0.0;
            pvVar25 = pvVar12;
            if ((long)pvVar11 - (long)pvVar12 != 0) {
              uVar5 = ((long)pvVar11 - (long)pvVar12 >> 3) * -0x5555555555555555;
              lVar29 = 0;
              uVar28 = 0;
              psVar18 = tree_num;
              pdVar19 = per_tree_depths;
              do {
                puVar7 = psVar18;
                if (tree_num == (size_t *)0x0) {
                  puVar7 = tree_num;
                }
                pdVar6 = (double *)(uVar5 * lVar8 + (long)pdVar19);
                if (per_tree_depths == (double *)0x0) {
                  pdVar6 = (double *)0x0;
                }
                traverse_hplane_fast_rowmajor<double,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar25->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar29),
                           model_outputs_ext,
                           PStack_90.numeric_data + PStack_90.ncols_numeric * (long)dStack_d8,
                           &dStack_f0,puVar7,pdVar6,(size_t)dStack_d8);
                uVar28 = uVar28 + 1;
                pvVar25 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar12 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar5 = ((long)pvVar12 - (long)pvVar25 >> 3) * -0x5555555555555555;
                psVar18 = psVar18 + nrows;
                pdVar19 = pdVar19 + 1;
                lVar29 = lVar29 + 0x18;
              } while (uVar28 < uVar5);
            }
            output_depths[(long)dStack_d8] = dStack_f0;
            dStack_d8 = (double)((long)dStack_d8 + 1);
            lVar8 = lVar8 + 8;
            pvVar11 = pvVar12;
            pPVar17 = (PredictionData<double,_unsigned_long> *)0xaaaaaaaaaaaaaaab;
            pvVar12 = pvVar25;
          } while (dStack_d8 != (double)nrows);
        }
        else {
          lVar8 = 0;
          dStack_d8 = 0.0;
          do {
            dStack_f0 = 0.0;
            pvVar25 = pvVar12;
            if ((long)pvVar11 - (long)pvVar12 != 0) {
              uVar5 = ((long)pvVar11 - (long)pvVar12 >> 3) * -0x5555555555555555;
              lVar29 = 0;
              uVar28 = 0;
              pdVar19 = per_tree_depths;
              psVar18 = tree_num;
              do {
                puVar7 = psVar18;
                if (tree_num == (size_t *)0x0) {
                  puVar7 = tree_num;
                }
                pdVar6 = (double *)(uVar5 * lVar8 + (long)pdVar19);
                if (per_tree_depths == (double *)0x0) {
                  pdVar6 = (double *)0x0;
                }
                traverse_hplane_fast_colmajor<PredictionData<double,unsigned_long>,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar25->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar29),
                           model_outputs_ext,&PStack_90,&dStack_f0,puVar7,pdVar6,(size_t)dStack_d8);
                uVar28 = uVar28 + 1;
                pvVar25 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar12 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar5 = ((long)pvVar12 - (long)pvVar25 >> 3) * -0x5555555555555555;
                psVar18 = psVar18 + nrows;
                pdVar19 = pdVar19 + 1;
                lVar29 = lVar29 + 0x18;
              } while (uVar28 < uVar5);
            }
            output_depths[(long)dStack_d8] = dStack_f0;
            dStack_d8 = (double)((long)dStack_d8 + 1);
            lVar8 = lVar8 + 8;
            pvVar11 = pvVar12;
            pPVar17 = &PStack_90;
            pvVar12 = pvVar25;
          } while (dStack_d8 != (double)nrows);
        }
      }
      else {
        uStack_b8 = nrows * 8;
        dVar35 = 0.0;
        dStack_d8 = 0.0;
        pvVar12 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar11 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          dStack_f0 = 0.0;
          pvVar25 = pvVar11;
          if ((long)pvVar12 - (long)pvVar11 != 0) {
            uVar5 = ((long)pvVar12 - (long)pvVar11 >> 3) * -0x5555555555555555;
            lVar8 = 0;
            uVar28 = 0;
            pdVar19 = per_tree_depths;
            psVar18 = tree_num;
            dStack_e0 = dVar35;
            do {
              puVar7 = psVar18;
              if (tree_num == (size_t *)0x0) {
                puVar7 = tree_num;
              }
              pdVar6 = (double *)(uVar5 * (long)dStack_e0 + (long)pdVar19);
              if (per_tree_depths == (double *)0x0) {
                pdVar6 = (double *)0x0;
              }
              traverse_hplane<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar25->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar8),
                         model_outputs_ext,&PStack_90,&dStack_f0,
                         (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                         (ImputedData<unsigned_long,_double> *)0x0,puVar7,pdVar6,(size_t)dStack_d8);
              uVar28 = uVar28 + 1;
              pvVar25 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar11 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar5 = ((long)pvVar11 - (long)pvVar25 >> 3) * -0x5555555555555555;
              psVar18 = (size_t *)((long)psVar18 + uStack_b8);
              pdVar19 = pdVar19 + 1;
              lVar8 = lVar8 + 0x18;
              pPVar17 = extraout_RDX_01;
              dVar35 = dStack_e0;
            } while (uVar28 < uVar5);
          }
          output_depths[(long)dStack_d8] = dStack_f0;
          dStack_d8 = (double)((long)dStack_d8 + 1);
          dVar35 = (double)((long)dVar35 + 8);
          pvVar12 = pvVar11;
          pvVar11 = pvVar25;
        } while (dStack_d8 != (double)nrows);
      }
      goto LAB_00145435;
    }
    if (model_outputs->missing_action != Fail) {
LAB_001450d3:
      lStack_c0 = 0;
      uStack_b8 = nrows * 8;
      dStack_e0 = 0.0;
      uVar5 = 0;
      sVar9 = 0;
      do {
        if ((uVar5 & 1) == 0) {
          pvVar24 = (model_outputs->trees).
                    super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = (long)(model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar24;
          uStack_e8 = uVar5;
          if (lVar8 == 0) {
            dVar35 = 0.0;
          }
          else {
            uVar5 = (lVar8 >> 3) * -0x5555555555555555;
            dVar35 = 0.0;
            lVar8 = 0;
            uVar28 = 0;
            psVar18 = tree_num;
            pdVar19 = per_tree_depths;
            do {
              puVar7 = psVar18;
              if (tree_num == (size_t *)0x0) {
                puVar7 = tree_num;
              }
              pdVar6 = (double *)(uVar5 * (long)dStack_e0 + (long)pdVar19);
              if (per_tree_depths == (double *)0x0) {
                pdVar6 = (double *)0x0;
              }
              dStack_d8 = dVar35;
              dVar35 = traverse_itree<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                                 ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                  ((long)&(pvVar24->
                                          super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                          _M_impl + lVar8),model_outputs,&PStack_90,
                                  (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                  (ImputedData<unsigned_long,_double> *)0x0,0.0,sVar9,puVar7,pdVar6,
                                  0);
              dVar35 = dStack_d8 + dVar35;
              uVar28 = uVar28 + 1;
              pvVar24 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar24 >> 3) *
                      -0x5555555555555555;
              psVar18 = (size_t *)((long)psVar18 + uStack_b8);
              pdVar19 = pdVar19 + 1;
              lVar8 = lVar8 + 0x18;
            } while (uVar28 < uVar5);
          }
          output_depths[sVar9] = dVar35;
          uVar5 = uStack_e8;
        }
        sVar9 = sVar9 + 1;
        dStack_e0 = (double)((long)dStack_e0 + 8);
      } while (sVar9 != nrows);
      if ((uVar5 & 1) != 0) {
        alStack_a8[0] = lStack_c0;
        if (lStack_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_addref();
        }
        uVar13 = std::rethrow_exception((exception_ptr)alStack_a8);
        if (lStack_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        _Unwind_Resume(uVar13);
      }
      pPVar17 = (PredictionData<double,_unsigned_long> *)per_tree_depths;
      if (lStack_c0 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
        pPVar17 = extraout_RDX_00;
      }
      goto LAB_00145435;
    }
    if (model_outputs->new_cat_action == Weighted) {
      if (((Xc_indptr == (size_t *)0x0) && (Xr_indptr == (size_t *)0x0)) &&
         (categ_data == (int *)0x0 || model_outputs->cat_split_type == SingleCateg))
      goto LAB_001459c8;
      goto LAB_001450d3;
    }
    if (Xc_indptr != (size_t *)0x0 || Xr_indptr != (size_t *)0x0) goto LAB_001450d3;
LAB_001459c8:
    if (model_outputs->has_range_penalty != false) goto LAB_001450d3;
    if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
      pvVar24 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar16 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = ((long)pvVar16 - (long)pvVar24 >> 3) * -0x5555555555555555;
      sVar9 = 0;
      do {
        if (pvVar16 == pvVar24) {
          dVar35 = 0.0;
        }
        else {
          dVar35 = 0.0;
          lVar29 = 0;
          do {
            psVar18 = tree_num + lVar29 * nrows;
            if (tree_num == (size_t *)0x0) {
              psVar18 = (size_t *)0x0;
            }
            pdVar19 = per_tree_depths + lVar8 * sVar9 + lVar29;
            if (per_tree_depths == (double *)0x0) {
              pdVar19 = (double *)0x0;
            }
            pIVar4 = pvVar24[lVar29].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pIVar27 = pIVar4;
            if (pIVar4->tree_left == 0) {
              sVar20 = 0;
            }
            else {
              psVar22 = &pIVar4->tree_left;
              do {
                psVar26 = &pIVar27->tree_right;
                if (numeric_data[sVar9 * ncols_numeric + pIVar27->col_num] <= pIVar27->num_split) {
                  psVar26 = psVar22;
                }
                sVar20 = *psVar26;
                pIVar27 = pIVar4 + sVar20;
                psVar22 = &pIVar4[sVar20].tree_left;
              } while (*psVar22 != 0);
            }
            dVar1 = pIVar27->score;
            if (psVar18 != (size_t *)0x0) {
              psVar18[sVar9] = sVar20;
            }
            if (pdVar19 != (double *)0x0) {
              *pdVar19 = dVar1;
            }
            dVar35 = dVar35 + dVar1;
            lVar29 = lVar29 + 1;
          } while (lVar29 != lVar8 + (ulong)(lVar8 == 0));
        }
        output_depths[sVar9] = dVar35;
        sVar9 = sVar9 + 1;
      } while (sVar9 != nrows);
    }
    else {
      dStack_e0 = (double)(nrows * 8);
      lVar8 = 0;
      dStack_d8 = 0.0;
      pvVar15 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar24 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pvVar16 = pvVar24;
        dStack_f0 = 0.0;
        pvVar24 = pvVar16;
        if ((long)pvVar15 - (long)pvVar16 != 0) {
          uVar5 = ((long)pvVar15 - (long)pvVar16 >> 3) * -0x5555555555555555;
          lVar29 = 0;
          uVar28 = 0;
          pdVar19 = per_tree_depths;
          psVar18 = tree_num;
          do {
            puVar7 = psVar18;
            if (tree_num == (size_t *)0x0) {
              puVar7 = tree_num;
            }
            pdVar6 = (double *)(uVar5 * lVar8 + (long)pdVar19);
            if (per_tree_depths == (double *)0x0) {
              pdVar6 = (double *)0x0;
            }
            traverse_itree_no_recurse<PredictionData<double,unsigned_long>,unsigned_long>
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ((long)&(pvVar24->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar29),model_outputs,
                       &PStack_90,&dStack_f0,puVar7,pdVar6,(size_t)dStack_d8);
            uVar28 = uVar28 + 1;
            pvVar24 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar16 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar5 = ((long)pvVar16 - (long)pvVar24 >> 3) * -0x5555555555555555;
            psVar18 = (size_t *)((long)psVar18 + (long)dStack_e0);
            pdVar19 = pdVar19 + 1;
            lVar29 = lVar29 + 0x18;
          } while (uVar28 < uVar5);
        }
        output_depths[(long)dStack_d8] = dStack_f0;
        dStack_d8 = (double)((long)dStack_d8 + 1);
        lVar8 = lVar8 + 8;
        pvVar15 = pvVar16;
      } while (dStack_d8 != (double)nrows);
    }
LAB_00145441:
    lVar8 = ((long)pvVar16 - (long)pvVar24 >> 3) * -0x5555555555555555;
    auVar33._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar33._0_8_ = lVar8;
    auVar33._12_4_ = 0x45300000;
    dStack_d0 = auVar33._8_8_ - 1.9342813113834067e+25;
    dStack_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dVar35 = model_outputs->exp_avg_depth * dStack_d8;
    SVar14 = model_outputs->scoring_metric;
    bVar30 = SVar14 == Density;
    uVar23 = (undefined7)((ulong)model_outputs >> 8);
    if (bVar30) {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar31 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar30 = true;
LAB_0014553c:
        uVar21 = (uint)CONCAT71(uVar23,model_outputs_ext->scoring_metric == BoxedDensity);
LAB_00145546:
        SVar14 = model_outputs_ext->scoring_metric;
        uStack_e8 = uStack_e8 & 0xffffffff00000000;
        goto LAB_00145553;
      }
      bVar31 = false;
LAB_0014557d:
      bVar32 = SVar14 == BoxedDensity2;
      uVar21 = 0;
LAB_00145586:
      uStack_e8 = (ulong)uStack_e8._4_4_ << 0x20;
    }
    else {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar30 = model_outputs_ext->scoring_metric == Density;
        bVar31 = true;
        if (SVar14 == BoxedRatio) goto LAB_0014553c;
        bVar31 = model_outputs_ext->scoring_metric == BoxedRatio;
        uVar21 = (uint)CONCAT71(uVar23,1);
        if ((SVar14 == BoxedDensity) ||
           (uVar21 = (uint)CONCAT71(uVar23,model_outputs_ext->scoring_metric == BoxedDensity),
           SVar14 != BoxedDensity2)) goto LAB_00145546;
        bVar32 = true;
        goto LAB_00145586;
      }
      bVar31 = SVar14 == BoxedRatio;
      if (SVar14 != BoxedDensity) goto LAB_0014557d;
      uVar21 = (uint)CONCAT71(uVar23,1);
      bVar30 = false;
      uStack_e8 = (ulong)uStack_e8._4_4_ << 0x20;
      bVar32 = false;
    }
  }
  uStack_b8 = CONCAT44(uStack_b8._4_4_,uVar21);
  if (standardize) {
    if (bVar30 || bVar32) {
      sVar9 = 0;
      do {
        output_depths[sVar9] = output_depths[sVar9] / -dStack_d8;
        sVar9 = sVar9 + 1;
      } while (nrows != sVar9);
    }
    else if ((char)uVar21 == '\0') {
      if (bVar31) {
        sVar9 = 0;
        do {
          output_depths[sVar9] = output_depths[sVar9] / dStack_d8;
          sVar9 = sVar9 + 1;
        } while (nrows != sVar9);
      }
      else {
        sVar9 = 0;
        dStack_e0 = dVar35;
        do {
          dVar35 = exp2(-output_depths[sVar9] / dStack_e0);
          output_depths[sVar9] = dVar35;
          sVar9 = sVar9 + 1;
        } while (nrows != sVar9);
      }
    }
    else {
      sVar9 = 0;
      do {
        dVar35 = exp(output_depths[sVar9] / dStack_d8);
        output_depths[sVar9] = -dVar35;
        sVar9 = sVar9 + 1;
      } while (nrows != sVar9);
    }
  }
  else if ((bVar30 || (char)uVar21 != '\0') || bVar32) {
    sVar9 = 0;
    do {
      dVar35 = exp(output_depths[sVar9] / dStack_d8);
      output_depths[sVar9] = dVar35;
      sVar9 = sVar9 + 1;
    } while (nrows != sVar9);
  }
  else if (bVar31) {
    sVar9 = 0;
    do {
      output_depths[sVar9] = output_depths[sVar9] / -dStack_d8;
      sVar9 = sVar9 + 1;
    } while (nrows != sVar9);
  }
  else {
    sVar9 = 0;
    do {
      output_depths[sVar9] = output_depths[sVar9] / dStack_d8;
      sVar9 = sVar9 + 1;
    } while (nrows != sVar9);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar30 || (uStack_b8 & 1) != 0) || bVar32)) {
    pEVar10 = (ExtIsoForest *)model_outputs;
    if ((char)uStack_e8 != '\0') {
      pEVar10 = model_outputs_ext;
    }
    lVar8 = nrows * -0x5555555555555555 *
            ((long)(pEVar10->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar10->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar8 != 0) {
      lVar29 = 0;
      do {
        dVar35 = exp(per_tree_depths[lVar29]);
        per_tree_depths[lVar29] = dVar35;
        lVar29 = lVar29 + 1;
      } while (lVar8 - lVar29 != 0);
    }
  }
  if (tree_num == (size_t *)0x0) {
    return;
  }
  if ((indexer == (TreesIndexer *)0x0) ||
     (pSVar2 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start,
     pSVar2 == (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
LAB_001457dd:
    remap_terminal_trees<PredictionData<double,unsigned_long>,unsigned_long>
              (model_outputs,model_outputs_ext,&PStack_90,tree_num,iStack_94);
  }
  else {
    if ((char)uStack_e8 == '\0') {
      if ((model_outputs->missing_action == Divide) ||
         (((lVar8 = (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
           model_outputs->new_cat_action == Weighted && (piStack_b0 != (int *)0x0)) &&
          (model_outputs->cat_split_type == SubSet)))) goto LAB_001457dd;
    }
    else {
      lVar8 = (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar8 != 0) {
      lVar29 = (lVar8 >> 3) * -0x5555555555555555;
      lVar8 = 0;
      do {
        puVar3 = pSVar2[lVar8].terminal_node_mappings.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar9 = 0;
        do {
          tree_num[sVar9] = puVar3[tree_num[sVar9]];
          sVar9 = sVar9 + 1;
        } while (nrows != sVar9);
        lVar8 = lVar8 + 1;
        tree_num = tree_num + nrows;
      } while (lVar8 != lVar29 + (ulong)(lVar29 == 0));
    }
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void predict_iforest(real_t numeric_data[], int categ_data[],
                     bool is_col_major, size_t ncols_numeric, size_t ncols_categ,
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double output_depths[],   sparse_ix tree_num[],
                     double per_tree_depths[],
                     TreesIndexer *indexer)
{
    predict_iforest<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     is_col_major, ncols_numeric, ncols_categ,
                     Xc, Xc_ind, Xc_indptr,
                     Xr, Xr_ind, Xr_indptr,
                     nrows, nthreads, standardize,
                     model_outputs, model_outputs_ext,
                     output_depths,   tree_num,
                     per_tree_depths,
                     indexer);
}